

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ConvertToHalfPass::CloseRelaxInst(ConvertToHalfPass *this,Instruction *inst)

{
  Instruction *pIVar1;
  bool bVar2;
  uint32_t uVar3;
  size_type sVar4;
  DefUseManager *this_00;
  anon_class_16_2_00a704c5 local_90;
  function<void_(spvtools::opt::Instruction_*)> local_80;
  anon_class_24_3_6682247d local_60;
  function<void_(unsigned_int_*)> local_48;
  bool local_26;
  bool local_25;
  Op local_24;
  bool hasStructOperand;
  bool relax;
  Instruction *pIStack_20;
  Instruction *inst_local;
  ConvertToHalfPass *this_local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)this;
  uVar3 = Instruction::result_id(inst);
  if (uVar3 == 0) {
    this_local._7_1_ = false;
  }
  else {
    uVar3 = Instruction::result_id(pIStack_20);
    bVar2 = IsRelaxed(this,uVar3);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      bVar2 = IsFloat(this,pIStack_20,0x20);
      if (bVar2) {
        bVar2 = IsDecoratedRelaxed(this,pIStack_20);
        if (bVar2) {
          uVar3 = Instruction::result_id(pIStack_20);
          AddRelaxed(this,uVar3);
          this_local._7_1_ = true;
        }
        else {
          local_24 = Instruction::opcode(pIStack_20);
          sVar4 = std::
                  unordered_set<spv::Op,_spvtools::opt::ConvertToHalfPass::hasher,_std::equal_to<spv::Op>,_std::allocator<spv::Op>_>
                  ::count(&this->closure_ops_,&local_24);
          pIVar1 = pIStack_20;
          if (sVar4 == 0) {
            this_local._7_1_ = false;
          }
          else {
            local_25 = true;
            local_26 = false;
            local_60.relax = &local_25;
            local_60.hasStructOperand = &local_26;
            local_60.this = this;
            std::function<void(unsigned_int*)>::
            function<spvtools::opt::ConvertToHalfPass::CloseRelaxInst(spvtools::opt::Instruction*)::__0,void>
                      ((function<void(unsigned_int*)> *)&local_48,&local_60);
            Instruction::ForEachInId(pIVar1,&local_48);
            std::function<void_(unsigned_int_*)>::~function(&local_48);
            if ((local_26 & 1U) == 0) {
              if ((local_25 & 1U) == 0) {
                local_25 = true;
                this_00 = Pass::get_def_use_mgr(&this->super_Pass);
                pIVar1 = pIStack_20;
                local_90.relax = &local_25;
                local_90.this = this;
                std::function<void(spvtools::opt::Instruction*)>::
                function<spvtools::opt::ConvertToHalfPass::CloseRelaxInst(spvtools::opt::Instruction*)::__1,void>
                          ((function<void(spvtools::opt::Instruction*)> *)&local_80,&local_90);
                analysis::DefUseManager::ForEachUser(this_00,pIVar1,&local_80);
                std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_80);
                if ((local_25 & 1U) == 0) {
                  this_local._7_1_ = false;
                }
                else {
                  uVar3 = Instruction::result_id(pIStack_20);
                  AddRelaxed(this,uVar3);
                  this_local._7_1_ = true;
                }
              }
              else {
                uVar3 = Instruction::result_id(pIStack_20);
                AddRelaxed(this,uVar3);
                this_local._7_1_ = true;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ConvertToHalfPass::CloseRelaxInst(Instruction* inst) {
  if (inst->result_id() == 0) return false;
  if (IsRelaxed(inst->result_id())) return false;
  if (!IsFloat(inst, 32)) return false;
  if (IsDecoratedRelaxed(inst)) {
    AddRelaxed(inst->result_id());
    return true;
  }
  if (closure_ops_.count(inst->opcode()) == 0) return false;
  // Can relax if all float operands are relaxed
  bool relax = true;
  bool hasStructOperand = false;
  inst->ForEachInId([&relax, &hasStructOperand, this](uint32_t* idp) {
    Instruction* op_inst = get_def_use_mgr()->GetDef(*idp);
    if (IsStruct(op_inst)) hasStructOperand = true;
    if (!IsFloat(op_inst, 32)) return;
    if (!IsRelaxed(*idp)) relax = false;
  });
  // If the instruction has a struct operand, we should not relax it, even if
  // all its uses are relaxed. Doing so could cause a mismatch between the
  // result type and the struct member type.
  if (hasStructOperand) {
    return false;
  }
  if (relax) {
    AddRelaxed(inst->result_id());
    return true;
  }
  // Can relax if all uses are relaxed
  relax = true;
  get_def_use_mgr()->ForEachUser(inst, [&relax, this](Instruction* uinst) {
    if (uinst->result_id() == 0 || !IsFloat(uinst, 32) ||
        (!IsDecoratedRelaxed(uinst) && !IsRelaxed(uinst->result_id())) ||
        !CanRelaxOpOperands(uinst)) {
      relax = false;
      return;
    }
  });
  if (relax) {
    AddRelaxed(inst->result_id());
    return true;
  }
  return false;
}